

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfoResult::finalizePostResultsReady(QHostInfoResult *this,QHostInfo *info)

{
  long lVar1;
  bool bVar2;
  pointer r;
  QSlotObjectBase *in_RDI;
  long in_FS_OFFSET;
  void *args [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QPointer::operator_cast_to_bool((QPointer<const_QObject> *)0x21bf93);
  if (bVar2) {
    r = std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::operator->
                  ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                   0x21bfd2);
    QPointer<const_QObject>::data((QPointer<const_QObject> *)0x21bfe4);
    QtPrivate::QSlotObjectBase::call(in_RDI,(QObject *)r,(void **)0x21bff5);
  }
  QObject::deleteLater();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoResult::finalizePostResultsReady(const QHostInfo &info)
{
    Q_ASSERT(slotObj);

    // we used to have a context object, but it's already destroyed
    if (receiver) {
        void *args[] = { nullptr, const_cast<QHostInfo *>(&info) };
        slotObj->call(const_cast<QObject *>(receiver.data()), args);
    }

    deleteLater();
}